

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ZSTD_format_e ZVar1;
  ZSTD_CCtx_params params_00;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [24];
  undefined1 in_stack_fffffffffffffe94 [100];
  undefined1 auVar14 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  ZSTD_strategy ZStack_94;
  ZSTD_frameParameters ZStack_90;
  undefined4 local_84;
  undefined1 local_80 [80];
  
  bVar6 = 0;
  uVar7 = params.cParams._0_8_;
  uVar10 = params.cParams.minMatch;
  uVar8 = params.cParams.hashLog;
  uVar9 = params.cParams.searchLog;
  uVar11 = params.cParams._20_8_;
  sVar2 = ZSTD_checkCParams(params.cParams);
  if (sVar2 < 0xffffffffffffff89) {
    ZVar1 = (cctx->requestedParams).format;
    memcpy(local_80,&(cctx->requestedParams).forceWindow,0x50);
    local_b0 = CONCAT44(params.cParams.windowLog,ZVar1);
    local_a8 = params.cParams._4_8_;
    uStack_a0 = params.cParams._12_8_;
    local_98 = params.cParams.targetLength;
    ZStack_94 = params.cParams.strategy;
    ZStack_90.contentSizeFlag = params.fParams.contentSizeFlag;
    ZStack_90.checksumFlag = params.fParams.checksumFlag;
    ZStack_90.noDictIDFlag = params.fParams.noDictIDFlag;
    local_84 = 3;
    puVar4 = &local_b0;
    puVar5 = (undefined8 *)&stack0xfffffffffffffe78;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    params_00.cParams.chainLog = uVar8;
    params_00.format = (int)uVar7;
    params_00.cParams.windowLog = (int)((ulong)uVar7 >> 0x20);
    params_00.cParams.hashLog = uVar9;
    params_00.cParams.searchLog = uVar10;
    params_00.cParams.minMatch = (uint)uVar11;
    params_00.cParams.targetLength = SUB84(uVar11,4);
    auVar12 = in_stack_fffffffffffffe94._4_12_;
    auVar13 = in_stack_fffffffffffffe94._52_24_;
    auVar14 = in_stack_fffffffffffffe94._76_24_;
    params_00.cParams.strategy = in_stack_fffffffffffffe94._0_4_;
    params_00.fParams.contentSizeFlag = auVar12._0_4_;
    params_00.fParams.checksumFlag = auVar12._4_4_;
    params_00.fParams.noDictIDFlag = auVar12._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffe94._16_4_;
    params_00.forceWindow = in_stack_fffffffffffffe94._20_4_;
    params_00.attachDictPref = in_stack_fffffffffffffe94._24_4_;
    params_00.nbWorkers = in_stack_fffffffffffffe94._28_4_;
    params_00._60_4_ = in_stack_fffffffffffffe94._32_4_;
    params_00.jobSize = in_stack_fffffffffffffe94._36_8_;
    params_00.overlapLog = in_stack_fffffffffffffe94._44_4_;
    params_00.rsyncable = in_stack_fffffffffffffe94._48_4_;
    params_00.ldmParams.enableLdm = auVar13._0_4_;
    params_00.ldmParams.hashLog = auVar13._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar13._8_4_;
    params_00.ldmParams.minMatchLength = auVar13._12_4_;
    params_00.ldmParams.hashRateLog = auVar13._16_4_;
    params_00.ldmParams.windowLog = auVar13._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar14._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar14._8_8_;
    params_00.customMem.opaque = (void *)auVar14._16_8_;
    sVar2 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,params_00,
                       srcSize,ZSTDb_not_buffered);
    if (sVar2 < 0xffffffffffffff89) {
      sVar2 = ZSTD_compressEnd(cctx,dst,dstCapacity,src,srcSize);
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    CHECK_F(ZSTD_checkCParams(params.cParams));
    return ZSTD_compress_internal(cctx,
                                  dst, dstCapacity,
                                  src, srcSize,
                                  dict, dictSize,
                                  params);
}